

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_ESI;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  Element *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff94;
  IdxCompare *in_stack_ffffffffffffff98;
  int local_30;
  int local_2c;
  int local_20;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[local_20];
    iVar2 = iVar1 + in_ECX;
    for (local_2c = iVar2; local_2c <= in_ESI; local_2c = local_2c + 1) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
      local_30 = local_2c;
      while( true ) {
        uVar4 = in_stack_ffffffffffffff90 & 0xffffff;
        if (iVar2 <= local_30) {
          iVar3 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::IdxCompare::operator()
                            (in_stack_ffffffffffffff98,
                             (Element *)
                             (CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90) &
                             0xffffffff00ffffff),in_stack_ffffffffffffff88);
          uVar4 = CONCAT13(iVar3 < 0,(int3)uVar4);
        }
        in_stack_ffffffffffffff90 = uVar4;
        if ((char)(in_stack_ffffffffffffff90 >> 0x18) == '\0') break;
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
        local_30 = local_30 - iVar1;
      }
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}